

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Position __thiscall AI::turn(AI *this,Position *other)

{
  long lVar1;
  Position PVar2;
  Position PVar3;
  long lVar4;
  long lVar5;
  
  PVar3.x = 0;
  PVar3.y = -1;
  lVar4 = 0;
  do {
    if (lVar4 == 0xf) {
      PVar2.x = 0;
      PVar2.y = 0;
      return PVar2;
    }
    lVar5 = 0;
    PVar2 = PVar3;
    while (lVar5 != 0xf) {
      PVar2 = (Position)((long)PVar2 + 0x100000000);
      lVar1 = lVar5 * 4;
      lVar5 = lVar5 + 1;
      if (*(int *)(*(long *)&(this->board->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar4].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + lVar1) == 0) {
        return PVar2;
      }
    }
    lVar4 = lVar4 + 1;
    PVar3 = (Position)((long)PVar3 + 1);
  } while( true );
}

Assistant:

Position AI::turn(const Position &other) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    Position preferedPos = {0, 0};

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                preferedPos.x = i;
                preferedPos.y = j;
                return preferedPos;
            }
        }
    }

    return preferedPos;
}